

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O3

void __thiscall FastPForLib::VarIntG8IU::VarIntG8IU(VarIntG8IU *this)

{
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  int desc;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  char cVar12;
  int aiStack_2038 [8];
  undefined1 local_2018 [16];
  undefined1 auStack_2008 [8072];
  int ithSize [8];
  
  lVar3 = 0;
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c79f0;
  puVar2 = local_2018;
  do {
    uVar5 = 1;
    iVar10 = -1;
    uVar4 = 0;
    iVar7 = 0;
    do {
      if ((uVar5 & (uint)lVar3) == 0) {
        aiStack_2038[(int)uVar4] = iVar7 - iVar10;
        uVar4 = (ulong)((int)uVar4 + 1);
        iVar10 = iVar7;
      }
      iVar7 = iVar7 + 1;
      uVar5 = uVar5 * 2;
    } while (iVar7 != 8);
    this->maskOutputSize[lVar3] = (int)uVar4;
    if (0 < (int)uVar4) {
      uVar6 = 0;
      lVar8 = 0;
      cVar9 = '\0';
      do {
        iVar10 = aiStack_2038[uVar6];
        lVar11 = 0;
        do {
          cVar12 = -1;
          if ((int)lVar11 < iVar10) {
            cVar12 = cVar9;
          }
          puVar2[lVar11 + (int)lVar8] = cVar12;
          cVar9 = cVar9 + ((int)lVar11 < iVar10);
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 != 4);
        uVar6 = uVar6 + 1;
        lVar8 = (int)lVar8 + lVar11;
      } while (uVar6 != uVar4);
    }
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 0x20;
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(local_2018 + lVar3));
    *(undefined1 (*) [16])((long)this->vecmask[0][0] + lVar3) = auVar1;
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(auStack_2008 + lVar3));
    *(undefined1 (*) [16])((long)this->vecmask[0][1] + lVar3) = auVar1;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x2000);
  return;
}

Assistant:

VarIntG8IU() {
    char mask[256][32];
    for (int desc = 0; desc <= 255; desc++) {
      int bitmask = 0x00000001;
      int bitindex = 0;
      // count number of 0 in the char
      int complete = 0;
      int ithSize[8];
      int lastpos = -1;
      while (bitindex < 8) {
        if ((desc & bitmask) == 0) {
          ithSize[complete] = bitindex - lastpos;
          lastpos = bitindex;
          complete++;
        }
        bitindex++;
        bitmask = bitmask << 1;
      }
      maskOutputSize[desc] = complete;

      int j = 0;
      int k = 0;
      for (int i = 0; i < complete; i++) {
        for (int n = 0; n < 4; n++) {
          if (n < ithSize[i]) {
            mask[desc][k] = static_cast<unsigned char>(j);
            j = j + 1;
          } else {
            mask[desc][k] = -1;
          }
          k = k + 1;
        }
      }
    }
    for (int desc = 0; desc <= 255; desc++) {
      vecmask[desc][0] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc]));
      vecmask[desc][1] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc] + 16));
    }
  }